

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  Mutex *this_00;
  int iVar1;
  undefined4 extraout_var;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar3;
  ulong uVar4;
  FieldDescriptor *pFVar5;
  FieldDescriptor *in_R8;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  Symbol SVar9;
  long lVar2;
  
  this_00 = this->builder_->pool_->mutex_;
  if (this_00 != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this_00);
  }
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  lVar2 = CONCAT44(extraout_var,iVar1);
  SVar9 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar2 + 8),LOOKUP_ALL);
  aVar3 = SVar9.field_1;
  if (SVar9.type == MESSAGE) {
    if (*(char *)(*(long *)(lVar2 + 0x20) + 0x58) == '\x01') {
      uVar4 = (ulong)*(int *)(aVar3.descriptor + 0x68);
      bVar7 = 0 < (long)uVar4;
      if (0 < (long)uVar4) {
        pFVar5 = *(FieldDescriptor **)(aVar3.descriptor + 0x70);
        uVar6 = 1;
        do {
          if ((((*(long *)(pFVar5 + 0x38) == lVar2) && (*(int *)(pFVar5 + 0x2c) == 0xb)) &&
              (*(int *)(pFVar5 + 0x30) == 1)) &&
             (*(FieldDescriptor **)(pFVar5 + 0x48) == (FieldDescriptor *)aVar3.descriptor)) {
            bVar8 = false;
            in_R8 = pFVar5;
          }
          else {
            bVar8 = true;
          }
          if (!bVar8) break;
          bVar7 = uVar6 < uVar4;
          pFVar5 = pFVar5 + 0x78;
          bVar8 = uVar6 != uVar4;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
      if (bVar7) {
        return in_R8;
      }
    }
  }
  else if ((SVar9.type == FIELD) &&
          (*(FieldDescriptor *)(aVar3.descriptor + 0x34) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar3.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }